

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int element6(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  if (tok < 0x17) {
    if (tok == 0xf) {
      return 0x27;
    }
    if (tok == 0x12) {
LAB_0057d11c:
      state->handler = element7;
      return 0x33;
    }
  }
  else {
    switch(tok) {
    case 0x17:
      state->level = state->level + 1;
      return 0x2c;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
      break;
    case 0x1e:
      state->handler = element7;
      return 0x35;
    case 0x1f:
      state->handler = element7;
      return 0x34;
    case 0x20:
      state->handler = element7;
      return 0x36;
    default:
      if (tok == 0x29) goto LAB_0057d11c;
    }
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
element6(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_OPEN_PAREN:
    state->level += 1;
    return XML_ROLE_GROUP_OPEN;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT;
  case XML_TOK_NAME_QUESTION:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_OPT;
  case XML_TOK_NAME_ASTERISK:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_REP;
  case XML_TOK_NAME_PLUS:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_PLUS;
  }
  return common(state, tok);
}